

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O3

bool slang::analysis::hasUnusedAttrib(Compilation *compilation,Symbol *symbol)

{
  AttributeSymbol *this;
  size_t sVar1;
  long *plVar2;
  byte bVar3;
  byte bVar4;
  ConstantValue *this_00;
  long in_RCX;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar5;
  
  sVar5 = ast::Compilation::getAttributes(compilation,symbol);
  if (sVar5._M_extent._M_extent_value._M_extent_value != 0) {
    in_RCX = 0;
    do {
      this = *(AttributeSymbol **)((long)sVar5._M_ptr + in_RCX);
      sVar1 = (this->super_Symbol).name._M_len;
      plVar2 = (long *)(this->super_Symbol).name._M_str;
      if (sVar1 == 0xc) {
        if ((int)plVar2[1] == 0x64657375 && *plVar2 == 0x6e755f656279616d) goto LAB_00376f6f;
      }
      else if ((sVar1 == 6) &&
              (*(short *)((long)plVar2 + 4) == 0x6465 && (int)*plVar2 == 0x73756e75)) {
LAB_00376f6f:
        this_00 = ast::AttributeSymbol::getValue(this);
        bVar3 = ConstantValue::isTrue(this_00);
        bVar4 = 1;
        goto LAB_00376f80;
      }
      in_RCX = in_RCX + 8;
    } while (sVar5._M_extent._M_extent_value._M_extent_value * 8 != in_RCX);
  }
  bVar3 = (byte)in_RCX;
  bVar4 = 0;
LAB_00376f80:
  return (bool)(bVar4 & bVar3);
}

Assistant:

static bool hasUnusedAttrib(const Compilation& compilation, const Symbol& symbol) {
    for (auto attr : compilation.getAttributes(symbol)) {
        if (attr->name == "unused"sv || attr->name == "maybe_unused"sv)
            return attr->getValue().isTrue();
    }
    return false;
}